

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_bench.cc
# Opt level: O2

void __thiscall leveldb::Benchmark::ReadRandom(Benchmark *this,ThreadState *thread)

{
  DB *pDVar1;
  Status SVar2;
  uint32_t uVar3;
  char *pcVar4;
  ulong uVar5;
  uint uVar6;
  int i;
  int iVar7;
  Slice msg_00;
  Status local_e0;
  char *local_d8;
  size_t local_d0;
  string value;
  ReadOptions options;
  char msg [100];
  
  options.verify_checksums = false;
  options.fill_cache = true;
  options.snapshot = (Snapshot *)0x0;
  value._M_dataplus._M_p = (pointer)&value.field_2;
  value._M_string_length = 0;
  value.field_2._M_local_buf[0] = '\0';
  uVar6 = 0;
  for (iVar7 = 0; iVar7 < this->reads_; iVar7 = iVar7 + 1) {
    uVar3 = Random::Next(&thread->rand);
    snprintf(msg,100,"%016d",(ulong)uVar3 % (ulong)(uint)FLAGS_num);
    pDVar1 = this->db_;
    local_d8 = msg;
    local_d0 = strlen(msg);
    (*pDVar1->_vptr_DB[5])(&local_e0,pDVar1,&options,&local_d8,&value);
    SVar2.state_ = local_e0.state_;
    Status::~Status(&local_e0);
    anon_unknown_0::Stats::FinishedSingleOp(&thread->stats);
    uVar6 = uVar6 + (SVar2.state_ == (char *)0x0);
  }
  uVar5 = (ulong)uVar6;
  snprintf(msg,100,"(%d of %d found)",uVar5,(ulong)(uint)this->num_);
  pcVar4 = (char *)strlen(msg);
  msg_00.size_ = uVar5;
  msg_00.data_ = pcVar4;
  anon_unknown_0::AppendWithSpace((anon_unknown_0 *)&(thread->stats).message_,(string *)msg,msg_00);
  std::__cxx11::string::~string((string *)&value);
  return;
}

Assistant:

void ReadRandom(ThreadState* thread) {
    ReadOptions options;
    std::string value;
    int found = 0;
    for (int i = 0; i < reads_; i++) {
      char key[100];
      const int k = thread->rand.Next() % FLAGS_num;
      snprintf(key, sizeof(key), "%016d", k);
      if (db_->Get(options, key, &value).ok()) {
        found++;
      }
      thread->stats.FinishedSingleOp();
    }
    char msg[100];
    snprintf(msg, sizeof(msg), "(%d of %d found)", found, num_);
    thread->stats.AddMessage(msg);
  }